

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nihgui.cpp
# Opt level: O0

void __thiscall Dialog::add(Dialog *this,Widget *widget,int grid_x,int grid_y,int grid_w,int grid_h)

{
  undefined4 in_ECX;
  undefined4 in_EDX;
  value_type *in_RSI;
  value_type in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  
  *(undefined4 *)(in_RSI + 1) = in_EDX;
  *(undefined4 *)((long)in_RSI + 0xc) = in_ECX;
  *(undefined4 *)(in_RSI + 2) = in_R8D;
  *(undefined4 *)((long)in_RSI + 0x14) = in_R9D;
  std::__cxx11::list<Widget_*,_std::allocator<Widget_*>_>::push_back
            ((list<Widget_*,_std::allocator<Widget_*>_> *)CONCAT44(in_R8D,in_R9D),in_RSI);
  in_RSI[3] = in_RDI;
  return;
}

Assistant:

void Dialog::add(Widget & widget, int grid_x, int grid_y, int grid_w,
   int grid_h)
{
   widget.grid_x = grid_x;
   widget.grid_y = grid_y;
   widget.grid_w = grid_w;
   widget.grid_h = grid_h;

   this->all_widgets.push_back(&widget);
   widget.dialog = this;
}